

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O1

void __thiscall
Memory::Recycler::CollectionStateChangedObserver::ValueChanged
          (CollectionStateChangedObserver *this,CollectionState *newVal,CollectionState *oldVal)

{
  return;
}

Assistant:

virtual void ValueChanged(const CollectionState& newVal, const CollectionState& oldVal)
        {
#ifdef ENABLE_BASIC_TELEMETRY
            if (oldVal == CollectionState::CollectionStateNotCollecting && 
                newVal != CollectionState::CollectionStateNotCollecting && 
                newVal != CollectionState::Collection_PreCollection && 
                newVal != CollectionState::CollectionStateExit)
            {
                this->recycler->GetRecyclerTelemetryInfo().StartPass(newVal);
            }
            else if (oldVal != CollectionState::CollectionStateNotCollecting && 
                oldVal != CollectionState::Collection_PreCollection && 
                oldVal != CollectionState::CollectionStateExit &&
                newVal == CollectionState::CollectionStateNotCollecting)
            {
                this->recycler->GetRecyclerTelemetryInfo().EndPass(oldVal);
            }
#endif
        }